

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O0

Am_Constraint * __thiscall
Web_Constraint::Copy(Web_Constraint *this,Am_Slot *param_1,Am_Slot *new_slot)

{
  bool bVar1;
  Am_Web_Data *pAVar2;
  Am_Web_Data *this_00;
  Am_Slot *new_slot_local;
  Am_Slot *param_1_local;
  Web_Constraint *this_local;
  
  if ((this->owner->create_proc == (Am_Web_Create_Proc *)0x0) ||
     (bVar1 = (*this->owner->create_proc)(new_slot), !bVar1)) {
    this_local = (Web_Constraint *)0x0;
  }
  else if (this->owner->prototype == (Am_Web_Data *)0x0) {
    this_00 = (Am_Web_Data *)operator_new(0x70);
    pAVar2 = this->owner;
    Am_Web_Data::Am_Web_Data
              (this_00,pAVar2->create_proc,pAVar2->initialize_proc,pAVar2->validate_proc);
    this_local = (Web_Constraint *)Am_Web_Data::operator_cast_to_Am_Constraint_(this_00);
  }
  else {
    pAVar2 = (Am_Web_Data *)operator_new(0x70);
    Am_Web_Data::Am_Web_Data(pAVar2,this->owner->prototype);
    this_local = (Web_Constraint *)Am_Web_Data::operator_cast_to_Am_Constraint_(pAVar2);
  }
  return &this_local->super_Am_Constraint;
}

Assistant:

Am_Constraint *
Web_Constraint::Copy(const Am_Slot &, const Am_Slot &new_slot)
{
  if (owner->create_proc && owner->create_proc(new_slot)) {
    if (owner->prototype)
      return *(new Am_Web_Data(owner->prototype));
    else
      return *(new Am_Web_Data(owner->create_proc, owner->initialize_proc,
                               owner->validate_proc));
  }
  return nullptr;
}